

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O2

void __thiscall
ser::CentralizedFileFormat::GlobalInfoFromJSON(CentralizedFileFormat *this,JSONNode *node)

{
  JSONNode **ppJVar1;
  JSONNode **ppJVar2;
  
  ppJVar1 = internalJSONNode::begin(node->internal);
  while( true ) {
    ppJVar2 = internalJSONNode::end(node->internal);
    if (ppJVar1 == ppJVar2) break;
    MetainfoSet::AddNode((this->super_FileFormat).pGlobalMetainfo_,*ppJVar1);
    ppJVar1 = ppJVar1 + 1;
  }
  return;
}

Assistant:

void CentralizedFileFormat::GlobalInfoFromJSON(const JSONNode& node)
{
    for (JSONNode::const_iterator iter = node.begin(); iter != node.end(); ++iter)
            pGlobalMetainfo_->AddNode(*iter);
}